

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::anon_unknown_15::ConsoleReporter::test_case_end
          (ConsoleReporter *this,CurrentTestCaseStats *st)

{
  _Setprecision _Var1;
  ostream *poVar2;
  void *pvVar3;
  CurrentTestCaseStats *st_local;
  ConsoleReporter *this_local;
  
  if ((this->tc->m_no_output & 1U) == 0) {
    if (((this->opt->duration & 1U) != 0) || ((st->failure_flags != 0 && (st->failure_flags != 1))))
    {
      logTestStart(this);
    }
    if ((this->opt->duration & 1U) != 0) {
      poVar2 = Color::operator<<(this->s,None);
      _Var1 = std::setprecision(6);
      poVar2 = std::operator<<(poVar2,_Var1);
      pvVar3 = (void *)std::ostream::operator<<(poVar2,std::fixed);
      poVar2 = (ostream *)std::ostream::operator<<(pvVar3,st->seconds);
      poVar2 = std::operator<<(poVar2," s: ");
      poVar2 = std::operator<<(poVar2,this->tc->m_name);
      std::operator<<(poVar2,"\n");
    }
    if ((st->failure_flags & 0x10U) != 0) {
      poVar2 = Color::operator<<(this->s,Red);
      poVar2 = std::operator<<(poVar2,"Test case exceeded time limit of ");
      _Var1 = std::setprecision(6);
      poVar2 = std::operator<<(poVar2,_Var1);
      pvVar3 = (void *)std::ostream::operator<<(poVar2,std::fixed);
      poVar2 = (ostream *)std::ostream::operator<<(pvVar3,this->tc->m_timeout);
      std::operator<<(poVar2,"!\n");
    }
    if ((st->failure_flags & 0x20U) == 0) {
      if ((st->failure_flags & 0x40U) == 0) {
        if ((st->failure_flags & 0x200U) == 0) {
          if ((st->failure_flags & 0x80U) == 0) {
            if ((st->failure_flags & 0x100U) != 0) {
              poVar2 = Color::operator<<(this->s,Yellow);
              poVar2 = std::operator<<(poVar2,"Failed exactly ");
              poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->tc->m_expected_failures);
              std::operator<<(poVar2," times as expected so marking it as not failed!\n");
            }
          }
          else {
            poVar2 = Color::operator<<(this->s,Red);
            poVar2 = std::operator<<(poVar2,"Didn\'t fail exactly ");
            poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->tc->m_expected_failures);
            std::operator<<(poVar2," times so marking it as failed!\n");
          }
        }
        else {
          poVar2 = Color::operator<<(this->s,Yellow);
          std::operator<<(poVar2,"Allowed to fail so marking it as not failed\n");
        }
      }
      else {
        poVar2 = Color::operator<<(this->s,Yellow);
        std::operator<<(poVar2,"Failed as expected so marking it as not failed\n");
      }
    }
    else {
      poVar2 = Color::operator<<(this->s,Red);
      std::operator<<(poVar2,"Should have failed but didn\'t! Marking it as failed!\n");
    }
    if ((st->failure_flags & 8U) != 0) {
      poVar2 = Color::operator<<(this->s,Red);
      std::operator<<(poVar2,"Aborting - too many failed asserts!\n");
    }
    Color::operator<<(this->s,None);
  }
  return;
}

Assistant:

void test_case_end(const CurrentTestCaseStats& st) override {
            if(tc->m_no_output)
                return;

            // log the preamble of the test case only if there is something
            // else to print - something other than that an assert has failed
            if(opt.duration ||
               (st.failure_flags && st.failure_flags != static_cast<int>(TestCaseFailureReason::AssertFailure)))
                logTestStart();

            if(opt.duration)
                s << Color::None << std::setprecision(6) << std::fixed << st.seconds
                  << " s: " << tc->m_name << "\n";

            if(st.failure_flags & TestCaseFailureReason::Timeout)
                s << Color::Red << "Test case exceeded time limit of " << std::setprecision(6)
                  << std::fixed << tc->m_timeout << "!\n";

            if(st.failure_flags & TestCaseFailureReason::ShouldHaveFailedButDidnt) {
                s << Color::Red << "Should have failed but didn't! Marking it as failed!\n";
            } else if(st.failure_flags & TestCaseFailureReason::ShouldHaveFailedAndDid) {
                s << Color::Yellow << "Failed as expected so marking it as not failed\n";
            } else if(st.failure_flags & TestCaseFailureReason::CouldHaveFailedAndDid) {
                s << Color::Yellow << "Allowed to fail so marking it as not failed\n";
            } else if(st.failure_flags & TestCaseFailureReason::DidntFailExactlyNumTimes) {
                s << Color::Red << "Didn't fail exactly " << tc->m_expected_failures
                  << " times so marking it as failed!\n";
            } else if(st.failure_flags & TestCaseFailureReason::FailedExactlyNumTimes) {
                s << Color::Yellow << "Failed exactly " << tc->m_expected_failures
                  << " times as expected so marking it as not failed!\n";
            }
            if(st.failure_flags & TestCaseFailureReason::TooManyFailedAsserts) {
                s << Color::Red << "Aborting - too many failed asserts!\n";
            }
            s << Color::None; // lgtm [cpp/useless-expression]
        }